

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

times * __thiscall lest::times::operator()(times *this,test *testing)

{
  _func_void_env_ptr *p_Var1;
  pointer pcVar2;
  __time_t _Var3;
  __suseconds_t _Var4;
  long lVar5;
  ostream *poVar6;
  undefined1 auVar7 [16];
  timeval t;
  long *local_60 [2];
  long local_50 [2];
  timeval local_40;
  
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  _Var4 = local_40.tv_usec;
  _Var3 = local_40.tv_sec;
  p_Var1 = testing->behaviour;
  pcVar2 = (testing->name)._M_dataplus._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar2,pcVar2 + (testing->name)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&(this->output).ctx,
                    (this->output).ctx.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::_M_assign((string *)&(this->output).testing);
  (*p_Var1)(&this->output);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  poVar6 = (this->super_action).os;
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 5;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  lVar5 = (local_40.tv_sec - _Var3) * 1000000 + (local_40.tv_usec - _Var4);
  auVar7._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar7._0_8_ = lVar5;
  auVar7._12_4_ = 0x45300000;
  poVar6 = std::ostream::_M_insert<double>
                     ((((auVar7._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / 1000000.0)
                      * 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ms: ",5);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(testing->name)._M_dataplus._M_p,(testing->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  return this;
}

Assistant:

times & operator()( test testing )
    {
        timer t;

        try
        {
            testing.behaviour( output( testing.name ) );
        }
        catch( message const & )
        {
            ++failures;
        }

        os << std::setw(5) << ( 1000 * t.elapsed_seconds() ) << " ms: " << testing.name  << "\n";

        return *this;
    }